

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult GenValidUsageInputsXrEraseSpaceFB
                   (XrSession session,XrSpaceEraseInfoFB *info,XrAsyncRequestIdFB *requestId)

{
  ValidateXrHandleResult VVar1;
  GenValidUsageXrInstanceInfo *pGVar2;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar3;
  allocator local_479;
  string local_478 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_458;
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [39];
  allocator local_3e9;
  string local_3e8 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3c8;
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [39];
  allocator local_331;
  string local_330 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_310;
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [32];
  GenValidUsageXrInstanceInfo *local_2a8;
  GenValidUsageXrInstanceInfo *gen_instance_info;
  GenValidUsageXrHandleInfo *gen_session_info;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> info_with_instance;
  string local_280 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_260;
  allocator local_241;
  string local_240 [39];
  allocator local_219;
  string local_218 [32];
  XrSession_T local_1f8 [32];
  ostringstream local_1d8 [8];
  ostringstream oss;
  ValidateXrHandleResult handle_result;
  XrObjectType local_4c;
  undefined1 local_48 [8];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  XrResult xr_result;
  XrAsyncRequestIdFB *requestId_local;
  XrSpaceEraseInfoFB *info_local;
  XrSession session_local;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  info_local = (XrSpaceEraseInfoFB *)session;
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  local_4c = XR_OBJECT_TYPE_SESSION;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSession_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)local_48
             ,(XrSession_T **)&info_local,&local_4c);
  VVar1 = VerifyXrSessionHandle((XrSession *)&info_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar3 = HandleInfo<XrSession_T_*>::getWithInstanceInfo
                      (&g_session_info,(XrSession_T *)info_local);
    pGVar2 = pVar3.second;
    gen_instance_info = (GenValidUsageXrInstanceInfo *)pVar3.first;
    local_2a8 = pGVar2;
    gen_session_info = (GenValidUsageXrHandleInfo *)gen_instance_info;
    info_with_instance.first = (GenValidUsageXrHandleInfo *)pGVar2;
    if (info == (XrSpaceEraseInfoFB *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2c8,"VUID-xrEraseSpaceFB-info-parameter",&local_2c9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2f0,"xrEraseSpaceFB",&local_2f1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_310,
                 (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 local_48);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_330,
                 "Invalid NULL for XrSpaceEraseInfoFB \"info\" which is not optional and must be non-NULL"
                 ,&local_331);
      CoreValidLogMessage(pGVar2,(string *)local_2c8,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          (string *)local_2f0,&local_310,(string *)local_330);
      std::__cxx11::string::~string(local_330);
      std::allocator<char>::~allocator((allocator<char> *)&local_331);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_310);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
      session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      info_with_instance.second._4_4_ = 1;
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_358,"xrEraseSpaceFB",&local_359);
      objects_info.
      super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           ValidateXrStruct(pGVar2,(string *)local_358,
                            (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                             *)local_48,true,true,info);
      std::__cxx11::string::~string(local_358);
      std::allocator<char>::~allocator((allocator<char> *)&local_359);
      pGVar2 = local_2a8;
      if (objects_info.
          super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS) {
        if (requestId == (XrAsyncRequestIdFB *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_410,"VUID-xrEraseSpaceFB-requestId-parameter",&local_411);
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_438,"xrEraseSpaceFB",&local_439);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    (&local_458,
                     (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)local_48);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    (local_478,
                     "Invalid NULL for XrAsyncRequestIdFB \"requestId\" which is not optional and must be non-NULL"
                     ,&local_479);
          CoreValidLogMessage(pGVar2,(string *)local_410,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              (string *)local_438,&local_458,(string *)local_478);
          std::__cxx11::string::~string(local_478);
          std::allocator<char>::~allocator((allocator<char> *)&local_479);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
          ~vector(&local_458);
          std::__cxx11::string::~string(local_438);
          std::allocator<char>::~allocator((allocator<char> *)&local_439);
          std::__cxx11::string::~string(local_410);
          std::allocator<char>::~allocator((allocator<char> *)&local_411);
          session_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
          info_with_instance.second._4_4_ = 1;
        }
        else {
          session_local._4_4_ =
               objects_info.
               super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
          info_with_instance.second._4_4_ = 1;
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_380,"VUID-xrEraseSpaceFB-info-parameter",&local_381);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_3a8,"xrEraseSpaceFB",&local_3a9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  (&local_3c8,
                   (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   local_48);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  (local_3e8,"Command xrEraseSpaceFB param info is invalid",&local_3e9);
        CoreValidLogMessage(pGVar2,(string *)local_380,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                            (string *)local_3a8,&local_3c8,(string *)local_3e8);
        std::__cxx11::string::~string(local_3e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                  (&local_3c8);
        std::__cxx11::string::~string(local_3a8);
        std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
        std::__cxx11::string::~string(local_380);
        std::allocator<char>::~allocator((allocator<char> *)&local_381);
        session_local._4_4_ =
             objects_info.
             super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
        info_with_instance.second._4_4_ = 1;
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1d8);
    std::operator<<((ostream *)local_1d8,"Invalid XrSession handle \"session\" ");
    HandleToHexString<XrSession_T*>(local_1f8);
    std::operator<<((ostream *)local_1d8,(string *)local_1f8);
    std::__cxx11::string::~string((string *)local_1f8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_218,"VUID-xrEraseSpaceFB-session-parameter",&local_219);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_240,"xrEraseSpaceFB",&local_241);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              (&local_260,
               (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               local_48);
    std::__cxx11::ostringstream::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,(string *)local_218,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)local_240,&local_260,local_280);
    std::__cxx11::string::~string((string *)local_280);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
              (&local_260);
    std::__cxx11::string::~string(local_240);
    std::allocator<char>::~allocator((allocator<char> *)&local_241);
    std::__cxx11::string::~string(local_218);
    std::allocator<char>::~allocator((allocator<char> *)&local_219);
    session_local._4_4_ = XR_ERROR_HANDLE_INVALID;
    info_with_instance.second._4_4_ = 1;
    std::__cxx11::ostringstream::~ostringstream(local_1d8);
  }
  std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
            ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
             local_48);
  return session_local._4_4_;
}

Assistant:

XrResult GenValidUsageInputsXrEraseSpaceFB(
XrSession session,
const XrSpaceEraseInfoFB* info,
XrAsyncRequestIdFB* requestId) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(session, XR_OBJECT_TYPE_SESSION);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSessionHandle(&session);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSession handle \"session\" ";
                oss << HandleToHexString(session);
                CoreValidLogMessage(nullptr, "VUID-xrEraseSpaceFB-session-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEraseSpaceFB",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_session_info.getWithInstanceInfo(session);
        GenValidUsageXrHandleInfo *gen_session_info = info_with_instance.first;
        (void)gen_session_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == info) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEraseSpaceFB-info-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEraseSpaceFB", objects_info,
                                "Invalid NULL for XrSpaceEraseInfoFB \"info\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrSpaceEraseInfoFB is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrEraseSpaceFB", objects_info,
                                                        true, true, info);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEraseSpaceFB-info-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEraseSpaceFB",
                                objects_info,
                                "Command xrEraseSpaceFB param info is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == requestId) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrEraseSpaceFB-requestId-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrEraseSpaceFB", objects_info,
                                "Invalid NULL for XrAsyncRequestIdFB \"requestId\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // NOTE: Can't validate "VUID-xrEraseSpaceFB-requestId-parameter" type
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}